

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O0

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::date_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::EraOperator>>
               (date_t *ldata,long *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long uVar1;
  bool bVar2;
  unsigned_long uVar3;
  long lVar4;
  TemplatedValidityMask<unsigned_long> *in_RCX;
  ValidityMask *in_RDX;
  void *in_RSI;
  void *in_RDI;
  byte in_stack_00000008;
  idx_t i;
  idx_t start;
  idx_t next;
  unsigned_long validity_entry;
  idx_t entry_idx;
  idx_t entry_count;
  idx_t base_idx;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff78;
  ValidityMask *mask_00;
  date_t in_stack_ffffffffffffff84;
  idx_t local_78;
  idx_t in_stack_ffffffffffffff90;
  unsigned_long uVar5;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffa0;
  unsigned_long local_58;
  ulong local_50;
  ulong local_48;
  unsigned_long local_40;
  byte local_31;
  TemplatedValidityMask<unsigned_long> *local_20;
  ValidityMask *local_18;
  void *local_10;
  void *local_8;
  
  local_31 = in_stack_00000008 & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  AssertRestrictFunction
            (in_RDI,(void *)((long)in_RDI + (long)in_RDX * 4),in_RSI,
             (void *)((long)in_RSI + (long)in_RDX * 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/include/duckdb/common/vector_operations/unary_executor.hpp"
             ,0x62);
  bVar2 = TemplatedValidityMask<unsigned_long>::AllValid(local_20);
  if (bVar2) {
    for (mask_00 = (ValidityMask *)0x0; mask_00 < local_18;
        mask_00 = (ValidityMask *)
                  ((long)&(mask_00->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1))
    {
      lVar4 = GenericUnaryWrapper::
              Operation<duckdb::DatePart::PartOperator<duckdb::DatePart::EraOperator>,duckdb::date_t,long>
                        (in_stack_ffffffffffffff84,mask_00,
                         CONCAT44(*(undefined4 *)((long)local_8 + (long)mask_00 * 4),
                                  in_stack_ffffffffffffff70),in_stack_ffffffffffffff68);
      *(long *)((long)local_10 + (long)mask_00 * 8) = lVar4;
    }
  }
  else {
    if ((local_31 & 1) == 0) {
      TemplatedValidityMask<unsigned_long>::Initialize
                ((TemplatedValidityMask<unsigned_long> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68);
    }
    else {
      TemplatedValidityMask<unsigned_long>::Copy
                (in_stack_ffffffffffffffa0,
                 (TemplatedValidityMask<unsigned_long> *)
                 CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 in_stack_ffffffffffffff90);
    }
    local_40 = 0;
    local_48 = TemplatedValidityMask<unsigned_long>::EntryCount(0x1fbd132);
    for (local_50 = 0; local_50 < local_48; local_50 = local_50 + 1) {
      local_58 = TemplatedValidityMask<unsigned_long>::GetValidityEntry
                           (in_stack_ffffffffffffff78,
                            CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      uVar3 = MinValue<unsigned_long>(local_40 + 0x40,(unsigned_long)local_18);
      bVar2 = TemplatedValidityMask<unsigned_long>::AllValid(local_58);
      if (bVar2) {
        for (; uVar1 = local_40, local_40 < uVar3; local_40 = local_40 + 1) {
          lVar4 = GenericUnaryWrapper::
                  Operation<duckdb::DatePart::PartOperator<duckdb::DatePart::EraOperator>,duckdb::date_t,long>
                            (in_stack_ffffffffffffff84,(ValidityMask *)in_stack_ffffffffffffff78,
                             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                             in_stack_ffffffffffffff68);
          *(long *)((long)local_10 + local_40 * 8) = lVar4;
        }
      }
      else {
        bVar2 = TemplatedValidityMask<unsigned_long>::NoneValid(local_58);
        uVar5 = local_40;
        uVar1 = uVar3;
        if (!bVar2) {
          for (; uVar1 = local_40, local_40 < uVar3; local_40 = local_40 + 1) {
            local_78 = local_40 - uVar5;
            bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid(&local_58,&local_78);
            if (bVar2) {
              in_stack_ffffffffffffff84.days = *(int32_t *)((long)local_8 + local_40 * 4);
              lVar4 = GenericUnaryWrapper::
                      Operation<duckdb::DatePart::PartOperator<duckdb::DatePart::EraOperator>,duckdb::date_t,long>
                                (in_stack_ffffffffffffff84,(ValidityMask *)in_stack_ffffffffffffff78
                                 ,CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                 in_stack_ffffffffffffff68);
              *(long *)((long)local_10 + local_40 * 8) = lVar4;
            }
          }
        }
      }
      local_40 = uVar1;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}